

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

EntryType * __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::GetFreeEntry(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
               *this)

{
  HeapAllocator *pHVar1;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *this_00;
  TrackAllocData local_40;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *local_18;
  EntryType *retFree;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  
  local_18 = this->free;
  if (local_18 == (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)0x0) {
    pHVar1 = this->allocator;
    retFree = (EntryType *)this;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&SimpleHashEntry<void*,Memory::Recycler::PinRecord>::typeinfo,
               0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SimpleHashTable.h"
               ,0x14a);
    pHVar1 = Memory::HeapAllocator::TrackAllocInfo(pHVar1,&local_40);
    this_00 = (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)
              new<Memory::HeapAllocator>(0x20,pHVar1,0x350bd0);
    SimpleHashEntry<void_*,_Memory::Recycler::PinRecord>::SimpleHashEntry(this_00);
    local_18 = this_00;
  }
  else {
    this->free = local_18->next;
    this->freecount = this->freecount - 1;
  }
  return local_18;
}

Assistant:

EntryType* GetFreeEntry()
    {
        EntryType* retFree = free;
        if (nullptr == retFree )
        {
            retFree = AllocatorNewStruct(TAllocator, allocator, EntryType);
        }
        else
        {
            free = retFree->next;
            freecount--;
        }
        return retFree;
    }